

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::TrackNoImplicitCallInlinees(BackwardPass *this,Instr *instr)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Func *pFVar5;
  Func *pFVar6;
  
  if (this->tag != DeadStorePhase) {
    return false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if (((((instr->field_0x38 & 0x10) == 0) &&
       (bVar3 = OpCodeAttr::CallInstr(instr->m_opcode), !bVar3)) &&
      (bVar3 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0), !bVar3)) &&
     ((bVar3 = GlobOpt::MayNeedBailOnImplicitCall(instr,(Value *)0x0,(Value *)0x0), !bVar3 &&
      (bVar3 = IR::Instr::HasAnyLoadHeapArgsOpCode(instr), !bVar3)))) {
    if (instr->m_opcode == InlineeStart) {
      if (instr->m_src1 != (Opnd *)0x0) {
        bVar3 = ProcessInlineeStart(this,instr);
        return bVar3;
      }
      if ((instr->m_func->field_0x240 & 2) != 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1fec,"(instr->m_func->m_hasInlineArgsOpt)",
                         "instr->m_func->m_hasInlineArgsOpt");
      if (bVar3) {
        *puVar4 = 0;
        return false;
      }
      goto LAB_003dd067;
    }
    if (instr->m_opcode != LdFuncExpr) {
      return false;
    }
  }
  if (instr->m_opcode == InlineeStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1fe3,"(instr->m_opcode != Js::OpCode::InlineeStart)",
                       "instr->m_opcode != Js::OpCode::InlineeStart");
    if (!bVar3) {
LAB_003dd067:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pFVar5 = instr->m_func;
  puVar1 = &pFVar5->field_0x240;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x8000;
  pFVar5 = pFVar5->parentFunc;
  if (pFVar5 != (Func *)0x0) {
    for (pFVar6 = pFVar5->parentFunc; pFVar6 != (Func *)0x0; pFVar6 = pFVar6->parentFunc) {
      pFVar5->field_0x241 = pFVar5->field_0x241 | 0x80;
      pFVar5 = pFVar6;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::TrackNoImplicitCallInlinees(IR::Instr *instr)
{
    if (this->tag != Js::DeadStorePhase || this->IsPrePass())
    {
        return false;
    }

    if (instr->HasBailOutInfo()
        || OpCodeAttr::CallInstr(instr->m_opcode)
        || instr->CallsAccessor()
        || GlobOpt::MayNeedBailOnImplicitCall(instr, nullptr, nullptr)
        || instr->HasAnyLoadHeapArgsOpCode()
        || instr->m_opcode == Js::OpCode::LdFuncExpr)
    {
        // This func has instrs with bailouts or implicit calls
        Assert(instr->m_opcode != Js::OpCode::InlineeStart);
        instr->m_func->SetHasImplicitCallsOnSelfAndParents();
        return false;
    }

    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (!instr->GetSrc1())
        {
            Assert(instr->m_func->m_hasInlineArgsOpt);
            return false;
        }
        return this->ProcessInlineeStart(instr);
    }

    return false;
}